

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_xcore.c
# Opt level: O2

int main(void)

{
  int iVar1;
  cs_detail *pcVar2;
  size_t count;
  cs_err cVar3;
  char *pcVar4;
  size_t len;
  size_t len_00;
  size_t sVar5;
  ulong uVar6;
  x86_avx_cc *pxVar7;
  cs_insn *insn;
  size_t local_38;
  
  cVar3 = cs_open(CS_ARCH_XCORE,CS_MODE_BIG_ENDIAN,&handle);
  if (cVar3 == CS_ERR_OK) {
    cs_option(handle,CS_OPT_DETAIL,3);
    local_38 = cs_disasm(handle,(uint8_t *)anon_var_dwarf_27,0x20,0x1000,0,&insn);
    if (local_38 == 0) {
      puts("****************");
      printf("Platform: %s\n","XCore");
      print_string_hex(anon_var_dwarf_27,(uchar *)0x20,len_00);
      puts("ERROR: Failed to disasm given code!");
    }
    else {
      puts("****************");
      printf("Platform: %s\n","XCore");
      print_string_hex(anon_var_dwarf_27,(uchar *)0x20,len);
      puts("Disasm:");
      for (sVar5 = 0; count = local_38, sVar5 != local_38; sVar5 = sVar5 + 1) {
        printf("0x%lx:\t%s\t%s\n",insn[sVar5].address,insn[sVar5].mnemonic,insn[sVar5].op_str);
        pcVar2 = insn[sVar5].detail;
        if (pcVar2 != (cs_detail *)0x0) {
          if ((pcVar2->field_6).x86.prefix[0] != '\0') {
            printf("\top_count: %u\n");
          }
          pxVar7 = &(pcVar2->field_6).x86.sib_index;
          for (uVar6 = 0; uVar6 < (pcVar2->field_6).x86.prefix[0]; uVar6 = uVar6 + 1) {
            iVar1 = pxVar7[-3];
            if (iVar1 == 3) {
              printf("\t\toperands[%u].type: MEM\n",uVar6 & 0xffffffff);
              if (*(byte *)(pxVar7 + -2) != 0) {
                pcVar4 = cs_reg_name(handle,(uint)*(byte *)(pxVar7 + -2));
                printf("\t\t\toperands[%u].mem.base: REG = %s\n",uVar6 & 0xffffffff,pcVar4);
              }
              if (*(uint8_t *)((long)pxVar7 + -7) != 0) {
                pcVar4 = cs_reg_name(handle,(uint)*(uint8_t *)((long)pxVar7 + -7));
                printf("\t\t\toperands[%u].mem.index: REG = %s\n",uVar6 & 0xffffffff,pcVar4);
              }
              if (pxVar7[-1] != 0) {
                printf("\t\t\toperands[%u].mem.disp: 0x%x\n",uVar6 & 0xffffffff);
              }
              if (*pxVar7 != X86_REG_AH) {
                printf("\t\t\toperands[%u].mem.direct: -1\n",uVar6 & 0xffffffff);
              }
            }
            else if (iVar1 == 2) {
              printf("\t\toperands[%u].type: IMM = 0x%x\n",uVar6 & 0xffffffff,(ulong)pxVar7[-2]);
            }
            else if (iVar1 == 1) {
              pcVar4 = cs_reg_name(handle,pxVar7[-2]);
              printf("\t\toperands[%u].type: REG = %s\n",uVar6 & 0xffffffff,pcVar4);
            }
            pxVar7 = pxVar7 + 4;
          }
          putchar(10);
        }
      }
      printf("0x%lx:\n",(ulong)insn[local_38 - 1].size + insn[local_38 - 1].address);
      cs_free(insn,count);
    }
    putchar(10);
    cs_close(&handle);
  }
  else {
    printf("Failed on cs_open() with error returned: %u\n",(ulong)cVar3);
  }
  return 0;
}

Assistant:

static void test()
{
#define XCORE_CODE "\xfe\x0f\xfe\x17\x13\x17\xc6\xfe\xec\x17\x97\xf8\xec\x4f\x1f\xfd\xec\x37\x07\xf2\x45\x5b\xf9\xfa\x02\x06\x1b\x10\x09\xfd\xec\xa7"

	struct platform platforms[] = {
		{
			CS_ARCH_XCORE,
			CS_MODE_BIG_ENDIAN,
			(unsigned char*)XCORE_CODE,
			sizeof(XCORE_CODE) - 1,
			"XCore",
		},
	};

	uint64_t address = 0x1000;
	cs_insn *insn;
	int i;
	size_t count;

	for (i = 0; i < sizeof(platforms)/sizeof(platforms[0]); i++) {
		cs_err err = cs_open(platforms[i].arch, platforms[i].mode, &handle);
		if (err) {
			printf("Failed on cs_open() with error returned: %u\n", err);
			continue;
		}

		cs_option(handle, CS_OPT_DETAIL, CS_OPT_ON);

		count = cs_disasm(handle, platforms[i].code, platforms[i].size, address, 0, &insn);
		if (count) {
			size_t j;

			printf("****************\n");
			printf("Platform: %s\n", platforms[i].comment);
			print_string_hex("Code:", platforms[i].code, platforms[i].size);
			printf("Disasm:\n");

			for (j = 0; j < count; j++) {
				printf("0x%"PRIx64":\t%s\t%s\n", insn[j].address, insn[j].mnemonic, insn[j].op_str);
				print_insn_detail(&insn[j]);
			}
			printf("0x%"PRIx64":\n", insn[j-1].address + insn[j-1].size);

			// free memory allocated by cs_disasm()
			cs_free(insn, count);
		} else {
			printf("****************\n");
			printf("Platform: %s\n", platforms[i].comment);
			print_string_hex("Code:", platforms[i].code, platforms[i].size);
			printf("ERROR: Failed to disasm given code!\n");
		}

		printf("\n");

		cs_close(&handle);
	}
}